

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# get_changed_ranges.c
# Opt level: O3

void ts_range_array_add(TSRangeArray *self,Length start,Length end)

{
  TSRange *pTVar1;
  uint uVar2;
  uint uVar3;
  ulong __nmemb;
  uint uVar4;
  uint uVar5;
  ulong local_38;
  
  uVar3 = self->size;
  uVar5 = start.bytes;
  uVar4 = end.bytes;
  if (uVar3 != 0) {
    uVar2 = uVar3 - 1;
    pTVar1 = self->contents;
    if (uVar5 <= pTVar1[uVar2].end_byte) {
      pTVar1[uVar2].end_byte = uVar4;
      pTVar1[uVar2].end_point.row = end.extent.row;
      pTVar1[uVar2].end_point.column = end.extent.column;
      return;
    }
  }
  if (uVar5 < uVar4) {
    if (uVar3 == self->capacity) {
      uVar2 = 8;
      if (8 < uVar3 * 2) {
        uVar2 = uVar3 * 2;
      }
      pTVar1 = self->contents;
      if (uVar3 < uVar2) {
        __nmemb = (ulong)uVar2;
        if (pTVar1 == (TSRange *)0x0) {
          pTVar1 = (TSRange *)calloc(__nmemb,0x18);
          local_38 = __nmemb;
          if (pTVar1 == (TSRange *)0x0) goto LAB_00128463;
        }
        else {
          pTVar1 = (TSRange *)realloc(pTVar1,__nmemb * 0x18);
          if (pTVar1 == (TSRange *)0x0) {
            ts_range_array_add_cold_1();
LAB_00128463:
            ts_range_array_add_cold_2();
            if (*(int *)(local_38 + 0x10) == 0) {
              __assert_fail("(uint32_t)(&self->cursor.stack)->size - 1 < (&self->cursor.stack)->size"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/tree-sitter/src/runtime/get_changed_ranges.c"
                            ,0x7e,"Length iterator_start_position(Iterator *)");
            }
            return;
          }
          uVar3 = self->size;
        }
        self->contents = pTVar1;
        self->capacity = uVar2;
      }
    }
    else {
      pTVar1 = self->contents;
    }
    self->size = uVar3 + 1;
    pTVar1[uVar3].start_point.row = start.extent.row;
    pTVar1[uVar3].start_point.column = start.extent.column;
    pTVar1[uVar3].end_point.row = end.extent.row;
    pTVar1[uVar3].end_point.column = end.extent.column;
    pTVar1[uVar3].start_byte = uVar5;
    pTVar1[uVar3].end_byte = uVar4;
  }
  return;
}

Assistant:

static void ts_range_array_add(TSRangeArray *self, Length start, Length end) {
  if (self->size > 0) {
    TSRange *last_range = array_back(self);
    if (start.bytes <= last_range->end_byte) {
      last_range->end_byte = end.bytes;
      last_range->end_point = end.extent;
      return;
    }
  }

  if (start.bytes < end.bytes) {
    TSRange range = { start.extent, end.extent, start.bytes, end.bytes };
    array_push(self, range);
  }
}